

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_operators.h
# Opt level: O1

Element_conflict __thiscall
Gudhi::persistence_fields::Multi_field_operators_with_small_characteristics::
get_partial_multiplicative_identity
          (Multi_field_operators_with_small_characteristics *this,
          Characteristic *productOfCharacteristics)

{
  uint *puVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Element_conflict EVar7;
  long lVar8;
  
  if (*productOfCharacteristics == 0) {
    EVar7 = 1;
  }
  else {
    puVar3 = (this->primes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)(this->primes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
    if (lVar8 == 0) {
      EVar7 = 0;
    }
    else {
      uVar2 = this->productOfAllCharacteristics_;
      uVar5 = 0;
      EVar7 = 0;
      do {
        if (*productOfCharacteristics % puVar3[uVar5] == 0) {
          puVar1 = (this->partials_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar5;
          uVar6 = EVar7 + *puVar1;
          if (CARRY4(EVar7,*puVar1)) {
            EVar7 = uVar6 - uVar2;
          }
          else {
            uVar4 = uVar2;
            if (uVar6 < uVar2) {
              uVar4 = 0;
            }
            EVar7 = uVar6 - uVar4;
          }
        }
        uVar5 = uVar5 + 1;
      } while ((uVar5 & 0xffffffff) < (ulong)(lVar8 >> 2));
    }
  }
  return EVar7;
}

Assistant:

Element get_partial_multiplicative_identity(const Characteristic& productOfCharacteristics) const {
    if (productOfCharacteristics == 0) {
      return get_multiplicative_identity();
    }
    Element multIdentity = 0;
    for (unsigned int idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        multIdentity = _add(multIdentity, partials_[idx], productOfAllCharacteristics_);
      }
    }
    return multIdentity;
  }